

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspm.cpp
# Opt level: O3

void __thiscall pg::MSPMSolver::run(MSPMSolver *this)

{
  uint64_t *puVar1;
  Game *pGVar2;
  _Elt_pointer piVar3;
  _Elt_pointer piVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  long *plVar11;
  ostream *poVar12;
  Game *pGVar13;
  Error *pEVar14;
  int from;
  uint uVar15;
  char *pcVar16;
  int iVar17;
  int from_1;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar32 [64];
  int from_2;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  int local_cc;
  _Deque_base<int,_std::allocator<int>_> local_c8;
  int *local_70;
  int *local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  int *local_38;
  undefined1 auVar24 [32];
  undefined1 auVar31 [64];
  
  pGVar13 = (this->super_Solver).game;
  uVar22 = pGVar13->n_vertices;
  local_38 = pGVar13->_priority;
  lVar21 = (long)*(int *)((long)local_38 + ((long)((uVar22 << 0x20) + -0x100000000) >> 0x1e));
  local_58 = lVar21 + 1;
  this->k = (int)local_58;
  uVar23 = local_58 * uVar22;
  local_60 = uVar23 * 4;
  local_68 = (int *)operator_new__(-(ulong)(uVar23 >> 0x3e != 0) | local_60);
  this->pms = local_68;
  local_40 = uVar22 * 4;
  uVar19 = -(ulong)(uVar22 >> 0x3e != 0) | local_40;
  local_70 = (int *)operator_new__(uVar19);
  this->strategy = local_70;
  uVar20 = 0xffffffffffffffff;
  if (-2 < lVar21) {
    uVar20 = lVar21 * 4 + 4;
  }
  local_50 = lVar21;
  piVar8 = (int *)operator_new__(uVar20);
  this->counts = piVar8;
  local_48 = uVar19;
  piVar9 = (int *)operator_new__(uVar19);
  this->cover = piVar9;
  piVar10 = (int *)operator_new__(uVar20);
  this->tmp = piVar10;
  piVar10 = (int *)operator_new__(uVar20);
  this->best = piVar10;
  if (0 < (long)uVar23) {
    memset(local_68,0,local_60);
  }
  uVar20 = local_40;
  if (0 < (long)uVar22) {
    memset(local_70,0xff,local_40);
    auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar27 = vpbroadcastq_avx512f(ZEXT816(0x3f));
    auVar28 = vpbroadcastq_avx512f(ZEXT816(1));
    auVar29 = vpbroadcastq_avx512f(ZEXT816(8));
    auVar30 = vpbroadcastq_avx512f();
    uVar19 = 0;
    puVar1 = ((this->super_Solver).disabled)->_bits;
    do {
      uVar23 = vpcmpuq_avx512f(auVar26,auVar30,2);
      vpsrlq_avx512f(auVar26,6);
      auVar31 = vpgatherqq_avx512f(puVar1[uVar22]);
      auVar32._8_8_ = (ulong)((byte)(uVar23 >> 1) & 1) * auVar31._8_8_;
      auVar32._0_8_ = (ulong)((byte)uVar23 & 1) * auVar31._0_8_;
      auVar32._16_8_ = (ulong)((byte)(uVar23 >> 2) & 1) * auVar31._16_8_;
      auVar32._24_8_ = (ulong)((byte)(uVar23 >> 3) & 1) * auVar31._24_8_;
      auVar32._32_8_ = (ulong)((byte)(uVar23 >> 4) & 1) * auVar31._32_8_;
      auVar32._40_8_ = (ulong)((byte)(uVar23 >> 5) & 1) * auVar31._40_8_;
      auVar32._48_8_ = (ulong)((byte)(uVar23 >> 6) & 1) * auVar31._48_8_;
      auVar32._56_8_ = (uVar23 >> 7) * auVar31._56_8_;
      auVar31 = vpandq_avx512f(auVar26,auVar27);
      auVar26 = vpaddq_avx512f(auVar26,auVar29);
      auVar31 = vpsrlvq_avx512f(auVar32,auVar31);
      uVar23 = vptestmq_avx512f(auVar31,auVar28);
      auVar24 = vpbroadcastd_avx512vl(ZEXT416(0xfffffffe));
      auVar25._4_4_ = (uint)((byte)(uVar23 >> 1) & 1) * auVar24._4_4_;
      auVar25._0_4_ = (uint)((byte)uVar23 & 1) * auVar24._0_4_;
      auVar25._8_4_ = (uint)((byte)(uVar23 >> 2) & 1) * auVar24._8_4_;
      auVar25._12_4_ = (uint)((byte)(uVar23 >> 3) & 1) * auVar24._12_4_;
      auVar25._16_4_ = (uint)((byte)(uVar23 >> 4) & 1) * auVar24._16_4_;
      auVar25._20_4_ = (uint)((byte)(uVar23 >> 5) & 1) * auVar24._20_4_;
      auVar25._24_4_ = (uint)((byte)(uVar23 >> 6) & 1) * auVar24._24_4_;
      auVar25._28_4_ = (uint)(byte)(uVar23 >> 7) * auVar24._28_4_;
      auVar24 = vmovdqu32_avx512vl(auVar25);
      *(undefined1 (*) [32])(piVar9 + uVar19) = auVar24;
      uVar19 = uVar19 + 8;
    } while ((uVar22 + 7 & 0xfffffffffffffff8) != uVar19);
  }
  if (-1 < (int)local_50) {
    memset(piVar8,0,(local_58 & 0xffffffff) << 2);
  }
  if (0 < (long)uVar22) {
    uVar19 = 0;
    do {
      if (piVar9[uVar19] == 0) {
        piVar8[local_38[uVar19]] = piVar8[local_38[uVar19]] + 1;
      }
      uVar19 = uVar19 + 1;
    } while (uVar22 != uVar19);
  }
  this->lift_attempt = 0;
  this->lift_count = 0;
  piVar8 = (int *)operator_new__(local_48);
  this->dirty = piVar8;
  if (0 < (long)uVar22) {
    memset(piVar8,0,uVar20);
  }
  uVar15 = (int)uVar22 - 1;
  this->coverdepth = 0;
  if (-1 < (int)uVar15) {
    uVar22 = (ulong)uVar15;
    do {
      iVar7 = this->cover[uVar22];
      if (iVar7 == 0) {
        bVar6 = lift(this,(int)uVar22,-1);
        iVar7 = this->cover[uVar22];
      }
      else {
        bVar6 = false;
      }
      if ((bVar6 != false) || (iVar7 == -1)) {
        pGVar13 = (this->super_Solver).game;
        piVar8 = pGVar13->_inedges;
        lVar21 = (long)pGVar13->_firstins[uVar22];
        iVar7 = piVar8[lVar21];
        if (iVar7 != -1) {
          piVar8 = piVar8 + lVar21 + 1;
          do {
            if ((this->cover[iVar7] == 0) && (bVar6 = lift(this,iVar7,(int)uVar22), bVar6)) {
              todo_push(this,iVar7);
            }
            iVar7 = *piVar8;
            piVar8 = piVar8 + 1;
          } while (iVar7 != -1);
        }
      }
      bVar6 = 0 < (long)uVar22;
      uVar22 = uVar22 - 1;
    } while (bVar6);
  }
  if ((this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur !=
      (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_start._M_cur) {
    do {
      iVar7 = todo_pop(this);
      if (this->cover[iVar7] + 1U < 2) {
        pGVar13 = (this->super_Solver).game;
        piVar8 = pGVar13->_inedges;
        lVar21 = (long)pGVar13->_firstins[iVar7];
        iVar18 = piVar8[lVar21];
        if (iVar18 != -1) {
          piVar8 = piVar8 + lVar21 + 1;
          do {
            if ((this->cover[iVar18] == 0) && (bVar6 = lift(this,iVar18,iVar7), bVar6)) {
              todo_push(this,iVar18);
            }
            iVar18 = *piVar8;
            piVar8 = piVar8 + 1;
          } while (iVar18 != -1);
        }
      }
      while( true ) {
        piVar3 = (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur;
        piVar4 = (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
        if (piVar4 != piVar3) break;
        iVar7 = this->coverdepth;
        if (iVar7 == 0) goto LAB_0016426f;
        this->coverdepth = iVar7 + -1;
        auVar26 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
        local_c8._M_impl.super__Deque_impl_data._M_finish._M_last = auVar26._48_8_;
        local_c8._M_impl.super__Deque_impl_data._M_finish._M_node = auVar26._56_8_;
        auVar26 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
        local_c8._M_impl.super__Deque_impl_data._0_16_ = auVar26._0_16_;
        local_c8._M_impl.super__Deque_impl_data._M_start._M_cur = auVar26._16_8_;
        local_c8._M_impl.super__Deque_impl_data._M_start._M_first = auVar26._24_8_;
        local_c8._M_impl.super__Deque_impl_data._M_start._M_last = auVar26._32_8_;
        local_c8._M_impl.super__Deque_impl_data._M_start._M_node = auVar26._40_8_;
        local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = auVar26._48_8_;
        local_c8._M_impl.super__Deque_impl_data._M_finish._M_first = auVar26._56_8_;
        std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_c8,0);
        local_cc = 0;
        pGVar13 = (this->super_Solver).game;
        if (0 < pGVar13->n_vertices) {
          lVar21 = 0;
          do {
            piVar8 = this->cover;
            if (piVar8[lVar21] == iVar7) {
              piVar8[lVar21] = 0;
              if ((this->super_Solver).trace != 0) {
                poVar12 = (this->super_Solver).logger;
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,"\x1b[7;31;1muncovering\x1b[m ",0x17);
                plVar11 = (long *)std::ostream::operator<<(poVar12,local_cc);
                std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
                std::ostream::put((char)plVar11);
                std::ostream::flush();
                pGVar13 = (this->super_Solver).game;
                piVar8 = this->cover;
              }
              uVar22 = (ulong)local_cc;
              uVar20 = 1L << (uVar22 & 0x3f) & (pGVar13->_owner)._bits[uVar22 >> 6];
              iVar18 = pGVar13->_outedges[pGVar13->_firstouts[uVar22]];
              if (iVar18 == -1) {
                if (piVar8[uVar22] != -1) {
LAB_00163ff2:
                  Oink::solve((this->super_Solver).oink,local_cc,(uint)(uVar20 == 0),-1);
                  this->cover[local_cc] = -1;
                  this->pms[(int)(local_cc * this->k + (uint)(uVar20 == 0))] = -1;
                  if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                      local_c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                              ((deque<int,std::allocator<int>> *)&local_c8,&local_cc);
                  }
                  else {
                    *local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_cc;
                    local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                         local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                  }
                  goto LAB_00164067;
                }
              }
              else {
                pGVar2 = (this->super_Solver).game;
                piVar9 = pGVar13->_outedges + (long)pGVar13->_firstouts[uVar22] + 1;
                bVar6 = false;
                do {
                  uVar19 = (ulong)iVar18;
                  if (piVar8[uVar19] != -2) {
                    if (((pGVar2->solved)._bits[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) == 0) {
                      bVar6 = true;
                    }
                    else if ((uVar20 != 0) !=
                             (((pGVar2->winner)._bits[uVar19 >> 6] & 1L << (uVar19 & 0x3f)) == 0)) {
                      Oink::solve((this->super_Solver).oink,local_cc,(uint)(uVar20 != 0),iVar18);
                      this->cover[local_cc] = -1;
                      this->pms[(int)(local_cc * this->k + (uint)(uVar20 != 0))] = -1;
                      if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                          local_c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                        std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                                  ((deque<int,std::allocator<int>> *)&local_c8,&local_cc);
                      }
                      else {
                        *local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_cc;
                        local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                             local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                      }
                      todo_push(this,local_cc);
                      piVar8 = this->cover;
                      uVar22 = (ulong)local_cc;
                      break;
                    }
                  }
                  iVar18 = *piVar9;
                  piVar9 = piVar9 + 1;
                } while (iVar18 != -1);
                if (piVar8[uVar22] != -1) {
                  if (!bVar6) goto LAB_00163ff2;
                  lift(this,local_cc,-1);
LAB_00164067:
                  todo_push(this,local_cc);
                }
              }
            }
            lVar21 = (long)local_cc + 1;
            local_cc = (int)lVar21;
            pGVar13 = (this->super_Solver).game;
          } while (lVar21 < pGVar13->n_vertices);
        }
        while (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
          iVar7 = *local_c8._M_impl.super__Deque_impl_data._M_start._M_cur;
          if (local_c8._M_impl.super__Deque_impl_data._M_start._M_cur ==
              local_c8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
            operator_delete(local_c8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
            local_c8._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_c8._M_impl.super__Deque_impl_data._M_start._M_node[1];
            local_c8._M_impl.super__Deque_impl_data._M_start._M_last =
                 local_c8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80;
            local_c8._M_impl.super__Deque_impl_data._M_start._M_first =
                 local_c8._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_c8._M_impl.super__Deque_impl_data._M_start._M_node =
                 local_c8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
          }
          else {
            local_c8._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_c8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
          }
          uVar22 = (ulong)iVar7;
          pGVar13 = (this->super_Solver).game;
          if (((pGVar13->solved)._bits[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) == 0) {
            pEVar14 = (Error *)__cxa_allocate_exception(0x40);
            Error::Error(pEVar14,"logic error",
                         "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/mspm.cpp"
                         ,0x1dc);
            __cxa_throw(pEVar14,&Error::typeinfo,Error::~Error);
          }
          iVar18 = pGVar13->_inedges[pGVar13->_firstins[uVar22]];
          if (iVar18 != -1) {
            piVar8 = pGVar13->_inedges + pGVar13->_firstins[uVar22];
            uVar20 = 1L << (uVar22 & 0x3f);
            uVar22 = (pGVar13->winner)._bits[uVar22 >> 6];
            do {
              local_cc = iVar18;
              uVar19 = (ulong)local_cc;
              if (this->cover[uVar19] == 0) {
                pGVar13 = (this->super_Solver).game;
                iVar18 = iVar7;
                if ((((pGVar13->_owner)._bits[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) == 0) ==
                    ((uVar22 & uVar20) != 0)) {
                  iVar18 = -1;
                  iVar17 = pGVar13->_outedges[pGVar13->_firstouts[uVar19]];
                  if (iVar17 != -1) {
                    piVar9 = pGVar13->_outedges + (long)pGVar13->_firstouts[uVar19] + 1;
                    do {
                      iVar17 = this->cover[iVar17];
                      if (-1 < iVar17) {
                        if (iVar17 != 0) {
                          pEVar14 = (Error *)__cxa_allocate_exception(0x40);
                          Error::Error(pEVar14,"logic error",
                                       "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/mspm.cpp"
                                       ,0x1e6);
                          __cxa_throw(pEVar14,&Error::typeinfo,Error::~Error);
                        }
                        goto LAB_00164228;
                      }
                      iVar17 = *piVar9;
                      piVar9 = piVar9 + 1;
                    } while (iVar17 != -1);
                  }
                }
                uVar15 = (uint)((uVar22 & uVar20) != 0);
                Oink::solve((this->super_Solver).oink,local_cc,uVar15,iVar18);
                this->cover[local_cc] = -1;
                this->pms[(int)(local_cc * this->k + uVar15)] = -1;
                if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                  std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                            ((deque<int,std::allocator<int>> *)&local_c8,&local_cc);
                }
                else {
                  *local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_cc;
                  local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                }
                todo_push(this,local_cc);
              }
LAB_00164228:
              piVar9 = piVar8 + 1;
              piVar8 = piVar8 + 1;
              iVar18 = *piVar9;
            } while (*piVar9 != -1);
          }
        }
        std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_c8);
      }
    } while (piVar4 != piVar3);
  }
LAB_0016426f:
  pGVar13 = (this->super_Solver).game;
  lVar21 = pGVar13->n_vertices;
  if ((this->super_Solver).trace != 0) {
    if (lVar21 < 1) goto LAB_00164463;
    uVar22 = 0;
    do {
      poVar12 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\x1b[1;31mnode ",0xc);
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,(int)uVar22);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"/",1);
      poVar12 = (ostream *)
                std::ostream::operator<<(poVar12,((this->super_Solver).game)->_priority[uVar22]);
      pcVar16 = " (odd)";
      bVar6 = ((((this->super_Solver).game)->_owner)._bits[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0
      ;
      if (!bVar6) {
        pcVar16 = " (even)";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar16,7 - (ulong)bVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\x1b[m is",6);
      pm_stream(this,(this->super_Solver).logger,this->pms + (long)(int)uVar22 * (long)this->k);
      if (-1 < this->cover[uVar22]) {
        poVar12 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," cover: ",8);
        std::ostream::operator<<(poVar12,this->cover[uVar22]);
      }
      poVar12 = (this->super_Solver).logger;
      cVar5 = (char)poVar12;
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
      pGVar13 = (this->super_Solver).game;
      uVar22 = uVar22 + 1;
      lVar21 = pGVar13->n_vertices;
    } while ((long)uVar22 < lVar21);
  }
  if (0 < lVar21) {
    uVar22 = 0;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) == 0) {
        lVar21 = (long)(int)uVar22 * (long)this->k;
        iVar7 = this->pms[lVar21];
        if ((iVar7 == -1) != (this->pms[lVar21 + 1] != -1)) {
          pEVar14 = (Error *)__cxa_allocate_exception(0x40);
          Error::Error(pEVar14,"logic error",
                       "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/mspm.cpp"
                       ,0x204);
          __cxa_throw(pEVar14,&Error::typeinfo,Error::~Error);
        }
        iVar18 = -1;
        if ((((pGVar13->_owner)._bits[uVar22 >> 6] & 1L << (uVar22 & 0x3f)) != 0) == (iVar7 != -1))
        {
          iVar18 = this->strategy[uVar22];
        }
        Oink::solve((this->super_Solver).oink,(int)uVar22,(uint)(iVar7 != -1),iVar18);
        pGVar13 = (this->super_Solver).game;
        lVar21 = pGVar13->n_vertices;
      }
      uVar22 = uVar22 + 1;
    } while ((long)uVar22 < lVar21);
  }
LAB_00164463:
  if (this->pms != (int *)0x0) {
    operator_delete__(this->pms);
  }
  if (this->strategy != (int *)0x0) {
    operator_delete__(this->strategy);
  }
  if (this->counts != (int *)0x0) {
    operator_delete__(this->counts);
  }
  if (this->cover != (int *)0x0) {
    operator_delete__(this->cover);
  }
  if (this->dirty != (int *)0x0) {
    operator_delete__(this->dirty);
  }
  if (this->tmp != (int *)0x0) {
    operator_delete__(this->tmp);
  }
  if (this->best != (int *)0x0) {
    operator_delete__(this->best);
  }
  poVar12 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"solved with ",0xc);
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,this->lift_count);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," lifts, ",8);
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,this->lift_attempt);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," lift attempts.",0xf);
  std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  return;
}

Assistant:

void
MSPMSolver::run()
{
    // determine k = highest priority + 1
    k = priority(nodecount()-1)+1;

    // now create the data structure, for each node
    pms = new int[k*nodecount()];
    strategy = new int[nodecount()];
    counts = new int[k];
    cover = new int[nodecount()];
    tmp = new int[k];
    best = new int[k];

    // initialize all measures to 0
    for (int i=0; i<k*nodecount(); i++) pms[i] = 0;

    // initialize strategy to -1
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // initialize cover
    for (int i=0; i<nodecount(); i++) cover[i] = disabled[i] ? -2 : 0;

    // initialize counts for each priority
    for (int i=0; i<k; i++) counts[i] = 0;
    for (int i=0; i<nodecount(); i++) if (cover[i] == 0) counts[priority(i)]++;

    // set number of lifts and lift attempts to 0
    lift_count = lift_attempt = 0;

    /**
     * Strategy that updates predecessors then marks updated predecessors for processing.
     * Uses a queue/stack to store the dirty vertices.
     */

    // initialize all nodes as not dirty
    dirty = new int[nodecount()];
    for (int n=0; n<nodecount(); n++) dirty[n] = 0;

    // initialize cover depth to 0
    coverdepth = 0;

    /**
     * First loop, starting with standard "lift" for nodes and "liftR" for predecessors.
     * Can already find "Top" here, so add covered nodes to <deferred>.
     */
    for (int n=nodecount()-1; n>=0; n--) {
        bool lifted = cover[n] == 0 and lift(n, -1);
        if (cover[n] == -1 or lifted) {
            for (auto curedge = ins(n); *curedge != -1; curedge++) {
                int from = *curedge;
                if (cover[from] == 0 and lift(from, n)) todo_push(from);
            }
        }
    }

    /**
     * The main loop
     */

    while (!todo.empty()) {
        int n = todo_pop();
        if (cover[n] == -1 or cover[n] == 0) {
            for (auto curedge = ins(n); *curedge != -1; curedge++) {
                int from = *curedge;
                if (cover[from] == 0 and lift(from, n)) todo_push(from);
            }
        }

        while (todo.empty() and coverdepth != 0) {
            int m = coverdepth--;
            std::queue<int> q;

            for (int n=0; n<nodecount(); n++) {
                if (cover[n] != m) continue;
                cover[n] = 0;

                if (trace) logger << "\033[7;31;1muncovering\033[m " << n << std::endl;

                // try to see if it is attracted
                const int pl = owner(n);
                bool escapes = false;
                for (auto curedge = outs(n); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (cover[to] == -2) continue;
                    if (game.isSolved(to)) {
                        if (game.getWinner(to) == pl) {
                            Solver::solve(n, pl, to);
                            cover[n] = -1;
                            pms[k*n+pl] = -1;
                            q.push(n);
                            todo_push(n);
                            break;
                        }
                    } else {
                        escapes = true;
                    }
                }
                if (cover[n] == -1) continue;
                if (!escapes) {
                    Solver::solve(n, 1-pl, -1);
                    cover[n] = -1;
                    pms[k*n+(1-pl)] = -1;
                    q.push(n);
                    todo_push(n);
                    continue;
                }

                // not attracted, lift
                lift(n, -1);

                // TODO: always or only if lifted?
                todo_push(n);
            }

            // attract within uncovered area to <node> for <pl>
            while (!q.empty()) {
                int n = q.front();
                q.pop();
                if (!game.isSolved(n)) LOGIC_ERROR;
                const bool pl = game.getWinner(n);
                for (auto curedge = ins(n); *curedge != -1; curedge++) {
                    int from = *curedge;
                    if (cover[from]) continue;
                    if (owner(from) != pl) {
                        bool escapes = false;
                        for (auto curedge = outs(from); *curedge != -1; curedge++) {
                            int to = *curedge;
                            if (cover[to] < 0) continue;
                            if (cover[to] != 0) LOGIC_ERROR;
                            escapes = true;
                            break;
                        }
                        if (escapes) continue;
                    }
                    Solver::solve(from, pl, owner(from) == pl ? n : -1);
                    // counts[priority(node)]--;
                    cover[from] = -1;
                    pms[k*from+pl] = -1;
                    q.push(from);
                    todo_push(from);
                }
            }
        }
    }

    if (trace) {
        for (int n=0; n<nodecount(); n++) {
            logger << "\033[1;31mnode " << n << "/" << priority(n) << (owner(n)?" (odd)":" (even)") << "\033[m is";
            pm_stream(logger, pms + k*n);
            if (cover[n] >= 0) logger << " cover: " << cover[n];
            logger << std::endl;
        }
    }

    // Now set dominions and derive strategy for even.
    for (int i=0; i<nodecount(); i++) {
        if (disabled[i]) continue;
        int *pm = pms + k*i;
        if ((pm[0] == -1) == (pm[1] == -1)) LOGIC_ERROR;
        const int winner = pm[0] == -1 ? 0 : 1;
        Solver::solve(i, winner, owner(i) == winner ? strategy[i] : -1);
    }

    delete[] pms;
    delete[] strategy;
    delete[] counts;
    delete[] cover;
    delete[] dirty;
    delete[] tmp;
    delete[] best;

    logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts." << std::endl;
}